

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::SimpleTypeHandler<1UL>::SetAccessors
          (SimpleTypeHandler<1UL> *this,DynamicObject *instance,PropertyId propertyId,Var getter,
          Var setter,PropertyOperationFlags flags)

{
  bool bVar1;
  int iVar2;
  BOOL BVar3;
  PathTypeHandlerBase *pPVar4;
  DictionaryTypeHandler *this_00;
  
  bVar1 = DoConvertToPathType((DynamicType *)(instance->super_RecyclableObject).type.ptr);
  if (bVar1) {
    pPVar4 = ConvertToPathType(this,instance);
    iVar2 = (*(pPVar4->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x34])
                      (pPVar4,instance,(ulong)(uint)propertyId,getter,setter,(ulong)flags);
    return iVar2;
  }
  this_00 = ConvertToDictionaryType(this,instance);
  BVar3 = DictionaryTypeHandlerBase<unsigned_short>::SetAccessors
                    (this_00,instance,propertyId,getter,setter,flags);
  return BVar3;
}

Assistant:

BOOL SimpleTypeHandler<size>::SetAccessors(DynamicObject* instance, PropertyId propertyId, Var getter, Var setter, PropertyOperationFlags flags)
    {
        if (DoConvertToPathType(instance->GetDynamicType()))
        {
            return ConvertToPathType(instance)->SetAccessors(instance, propertyId, getter, setter, flags);
        }
        else
        {
            // Don't attempt to share cross-site function types
            return ConvertToDictionaryType(instance)->SetAccessors(instance, propertyId, getter, setter, flags);
        }
    }